

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O0

void lzham::lzham_free(void *p)

{
  ulong in_RDI;
  
  if (in_RDI != 0) {
    if ((in_RDI & 0xf) == 0) {
      (*(code *)g_pRealloc)(in_RDI,0,0,1,g_pUser_data);
    }
    else {
      lzham_mem_error((char *)0x134138);
    }
  }
  return;
}

Assistant:

void lzham_free(void* p)
   {
      if (!p)
         return;

      if (reinterpret_cast<ptr_bits_t>(p) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1))
      {
         lzham_mem_error("lzham_free: bad ptr");
         return;
      }

#if LZHAM_MEM_STATS
      size_t cur_size = (*g_pMSize)(p, g_pUser_data);
      update_total_allocated(-1, -static_cast<mem_stat_t>(cur_size));
#endif

      (*g_pRealloc)(p, 0, NULL, true, g_pUser_data);
   }